

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ExtensionObject_copy(UA_ExtensionObject *src,UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_2c;
  UA_StatusCode retval;
  UA_DataType *__local;
  UA_ExtensionObject *dst_local;
  UA_ExtensionObject *src_local;
  
  local_2c = 0;
  if (src->encoding < UA_EXTENSIONOBJECT_DECODED) {
    dst->encoding = src->encoding;
    UVar1 = NodeId_copy(&(src->content).encoded.typeId,&(dst->content).encoded.typeId,
                        (UA_DataType *)0x0);
    local_2c = UA_ByteString_copy(&(src->content).encoded.body,&(dst->content).encoded.body);
    local_2c = local_2c | UVar1;
  }
  else if (src->encoding - UA_EXTENSIONOBJECT_DECODED < 2) {
    if (((src->content).decoded.type == (UA_DataType *)0x0) ||
       ((src->content).decoded.data == (void *)0x0)) {
      return 0x80020000;
    }
    dst->encoding = UA_EXTENSIONOBJECT_DECODED;
    (dst->content).decoded.type = (src->content).decoded.type;
    local_2c = UA_Array_copy((src->content).decoded.data,1,&(dst->content).decoded.data,
                             (src->content).decoded.type);
  }
  return local_2c;
}

Assistant:

static UA_StatusCode
ExtensionObject_copy(UA_ExtensionObject const *src, UA_ExtensionObject *dst,
                     const UA_DataType *_) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(src->encoding) {
    case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
    case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
    case UA_EXTENSIONOBJECT_ENCODED_XML:
        dst->encoding = src->encoding;
        retval = NodeId_copy(&src->content.encoded.typeId,
                             &dst->content.encoded.typeId, NULL);
        retval |= UA_ByteString_copy(&src->content.encoded.body,
                                     &dst->content.encoded.body);
        break;
    case UA_EXTENSIONOBJECT_DECODED:
    case UA_EXTENSIONOBJECT_DECODED_NODELETE:
        if(!src->content.decoded.type || !src->content.decoded.data)
            return UA_STATUSCODE_BADINTERNALERROR;
        dst->encoding = UA_EXTENSIONOBJECT_DECODED;
        dst->content.decoded.type = src->content.decoded.type;
        retval = UA_Array_copy(src->content.decoded.data, 1,
            &dst->content.decoded.data, src->content.decoded.type);
        break;
    default:
        break;
    }
    return retval;
}